

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_update_servers.c
# Opt level: O1

ares_status_t
ares_sconfig_append_fromstr
          (ares_channel_t *channel,ares_llist_t **sconfig,char *str,ares_bool_t ignore_invalid)

{
  ares_buf_t *buf;
  char cVar1;
  unsigned_short uVar2;
  ares_status_t aVar3;
  ares_bool_t aVar4;
  int iVar5;
  ares_status_t aVar6;
  size_t sVar7;
  ares_buf_t *buf_00;
  undefined8 *puVar8;
  char *pcVar9;
  void *pvVar10;
  size_t sVar11;
  long lVar12;
  uchar *puVar13;
  size_t idx;
  bool bVar14;
  byte bVar15;
  ares_array_t *list;
  ares_sconfig_t s;
  ares_uri_t *uri;
  size_t addrlen;
  char hoststr [256];
  ares_array_t *local_1c0;
  undefined1 local_1b8 [20];
  unsigned_short uStack_1a4;
  unsigned_short uStack_1a2;
  char acStack_1a0 [24];
  ares_uri_t *local_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined6 uStack_170;
  undefined2 local_16a;
  undefined6 uStack_168;
  undefined8 uStack_162;
  ares_channel_t *local_150;
  ares_llist_t **local_148;
  size_t local_140;
  uchar local_138 [64];
  undefined4 local_f8;
  undefined2 local_f4;
  
  bVar15 = 0;
  local_1c0 = (ares_array_t *)0x0;
  local_150 = channel;
  local_148 = sconfig;
  sVar7 = ares_strlen(str);
  buf_00 = ares_buf_create_const((uchar *)str,sVar7);
  if (buf_00 == (ares_buf_t *)0x0) {
    aVar3 = ARES_ENOMEM;
  }
  else {
    aVar3 = ares_buf_split(buf_00,(uchar *)" ,",2,ARES_BUF_SPLIT_NONE,0,&local_1c0);
    if (aVar3 == ARES_SUCCESS) {
      sVar7 = ares_array_len(local_1c0);
      aVar3 = ARES_SUCCESS;
      if (sVar7 != 0) {
        idx = 0;
        do {
          puVar8 = (undefined8 *)ares_array_at(local_1c0,idx);
          buf = (ares_buf_t *)*puVar8;
          local_188 = (ares_uri_t *)0x0;
          aVar3 = ares_uri_parse_buf(&local_188,buf);
          if (aVar3 == ARES_SUCCESS) {
            pcVar9 = ares_uri_get_scheme(local_188);
            aVar4 = ares_streq("dns",pcVar9);
            if (aVar4 == ARES_FALSE) {
LAB_00118bbb:
              ares_uri_destroy(local_188);
              goto LAB_00118bc5;
            }
            pcVar9 = ares_uri_get_host(local_188);
            ares_strcpy((char *)local_138,pcVar9,0x100);
            pcVar9 = strchr((char *)local_138,0x25);
            if (pcVar9 != (char *)0x0) {
              *pcVar9 = '\0';
              ares_strcpy(acStack_1a0,pcVar9 + 1,0x10);
            }
            local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffff00000000;
            pvVar10 = ares_dns_pton((char *)local_138,(ares_addr *)local_1b8,&local_140);
            if (pvVar10 == (void *)0x0) goto LAB_00118bbb;
            uVar2 = ares_uri_get_port(local_188);
            stack0xfffffffffffffe58 = CONCAT24(uVar2,local_1b8._16_4_);
            stack0xfffffffffffffe58 = CONCAT26(uVar2,stack0xfffffffffffffe58);
            pcVar9 = ares_uri_get_query_key(local_188,"tcpport");
            if (pcVar9 != (char *)0x0) {
              iVar5 = atoi(pcVar9);
              stack0xfffffffffffffe58 = CONCAT24((short)iVar5,local_1b8._16_4_);
            }
            ares_uri_destroy(local_188);
            aVar3 = ARES_SUCCESS;
          }
          else {
LAB_00118bc5:
            uStack_168 = 0;
            uStack_162 = 0;
            uStack_178 = 0;
            uStack_170 = 0;
            local_16a = 0;
            local_188 = (ares_uri_t *)0x0;
            uStack_180 = 0;
            local_1b8._0_8_ = 0;
            local_1b8._8_8_ = 0;
            stack0xfffffffffffffe58 = 0;
            acStack_1a0[0] = '\0';
            acStack_1a0[1] = '\0';
            acStack_1a0[2] = '\0';
            acStack_1a0[3] = '\0';
            acStack_1a0[4] = '\0';
            acStack_1a0[5] = '\0';
            acStack_1a0[6] = '\0';
            acStack_1a0[7] = '\0';
            acStack_1a0[8] = '\0';
            acStack_1a0[9] = '\0';
            acStack_1a0[10] = '\0';
            acStack_1a0[0xb] = '\0';
            acStack_1a0[0xc] = '\0';
            acStack_1a0[0xd] = '\0';
            acStack_1a0[0xe] = '\0';
            acStack_1a0[0xf] = '\0';
            acStack_1a0[0x10] = '\0';
            acStack_1a0[0x11] = '\0';
            acStack_1a0[0x12] = '\0';
            acStack_1a0[0x13] = '\0';
            ares_buf_consume_whitespace(buf,ARES_TRUE);
            aVar4 = ares_buf_begins_with(buf,(uchar *)"[",1);
            if (aVar4 == ARES_FALSE) {
              ares_buf_tag(buf);
              sVar11 = ares_buf_consume_until_charset(buf,".",1,ARES_TRUE);
              ares_buf_tag_rollback(buf);
              ares_buf_tag(buf);
              if (sVar11 - 1 < 3) {
                sVar11 = ares_buf_consume_charset(buf,(uchar *)"0123456789.",0xb);
                if (sVar11 == 0) {
                  aVar3 = ARES_EBADSTR;
                  bVar14 = false;
                }
                else {
LAB_00118d0a:
                  aVar3 = ares_buf_tag_fetch_string(buf,(char *)&local_188,0x2e);
                  bVar14 = aVar3 == ARES_SUCCESS;
                  if (bVar14) {
                    aVar3 = ARES_EBADSTR;
                  }
                }
              }
              else {
                builtin_memcpy(local_138 + 0x10,"456789.:",9);
                builtin_memcpy(local_138,"ABCDEFabcdef0123",0x10);
                sVar11 = ares_buf_consume_charset(buf,local_138,0x18);
                if (sVar11 != 0) goto LAB_00118d0a;
                bVar14 = false;
                aVar3 = ARES_EBADSTR;
              }
              if (bVar14) goto LAB_00118d3f;
            }
            else {
              ares_buf_consume(buf,1);
              ares_buf_tag(buf);
              sVar11 = ares_buf_consume_until_charset(buf,(uchar *)"]",1,ARES_TRUE);
              if (sVar11 != 0xffffffffffffffff) {
                aVar3 = ares_buf_tag_fetch_string(buf,(char *)&local_188,0x2e);
                if (aVar3 != ARES_SUCCESS) goto LAB_00118ece;
                ares_buf_consume(buf,1);
LAB_00118d3f:
                local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffff00000000;
                pvVar10 = ares_dns_pton((char *)&local_188,(ares_addr *)local_1b8,&local_140);
                if (pvVar10 != (void *)0x0) {
                  aVar4 = ares_buf_begins_with(buf,(uchar *)":",1);
                  if (aVar4 != ARES_FALSE) {
                    ares_buf_consume(buf,1);
                    ares_buf_tag(buf);
                    sVar11 = ares_buf_consume_charset(buf,(uchar *)"0123456789",10);
                    if (sVar11 == 0) {
                      bVar14 = false;
                      aVar6 = ARES_EBADSTR;
                    }
                    else {
                      aVar6 = ares_buf_tag_fetch_string(buf,(char *)local_138,6);
                      bVar14 = aVar6 == ARES_SUCCESS;
                      if (bVar14) {
                        iVar5 = atoi((char *)local_138);
                        stack0xfffffffffffffe58 = CONCAT24((short)iVar5,local_1b8._16_4_);
                        stack0xfffffffffffffe58 = CONCAT26((short)iVar5,stack0xfffffffffffffe58);
                        aVar6 = aVar3;
                      }
                    }
                    aVar3 = aVar6;
                    if (!bVar14) goto LAB_00118ece;
                  }
                  aVar4 = ares_buf_begins_with(buf,(uchar *)"%",1);
                  if (aVar4 != ARES_FALSE) {
                    pcVar9 = 
                    "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789.-_\\:{}";
                    puVar13 = local_138;
                    for (lVar12 = 8; lVar12 != 0; lVar12 = lVar12 + -1) {
                      *(undefined8 *)puVar13 = *(undefined8 *)pcVar9;
                      pcVar9 = pcVar9 + ((ulong)bVar15 * -2 + 1) * 8;
                      puVar13 = puVar13 + (ulong)bVar15 * -0x10 + 8;
                    }
                    local_f4 = 0x7d;
                    local_f8 = 0x7b3a5c5f;
                    ares_buf_consume(buf,1);
                    ares_buf_tag(buf);
                    sVar11 = ares_buf_consume_charset(buf,local_138,0x45);
                    if (sVar11 == 0) {
                      bVar14 = false;
                      aVar3 = ARES_EBADSTR;
                    }
                    else {
                      aVar6 = ares_buf_tag_fetch_string(buf,acStack_1a0,0x10);
                      bVar14 = aVar6 == ARES_SUCCESS;
                      if (!bVar14) {
                        aVar3 = aVar6;
                      }
                    }
                    if (!bVar14) goto LAB_00118ece;
                  }
                  ares_buf_consume_whitespace(buf,ARES_TRUE);
                  sVar11 = ares_buf_len(buf);
                  aVar3 = ARES_EBADSTR;
                  if (sVar11 == 0) {
                    aVar3 = ARES_SUCCESS;
                  }
                  goto LAB_00118ece;
                }
              }
              aVar3 = ARES_EBADSTR;
            }
          }
LAB_00118ece:
          cVar1 = (ignore_invalid != ARES_FALSE) * '\x03' + '\x02';
          if (aVar3 == ARES_SUCCESS) {
            aVar3 = ares_sconfig_append(local_150,local_148,(ares_addr *)local_1b8,uStack_1a2,
                                        uStack_1a4,acStack_1a0);
            cVar1 = (aVar3 != ARES_SUCCESS) * '\x02';
          }
          if ((cVar1 != '\0') && (cVar1 != '\x05')) {
            if (cVar1 != '\x02') {
              return aVar3;
            }
            goto LAB_00118f31;
          }
          idx = idx + 1;
        } while (sVar7 != idx);
        aVar3 = ARES_SUCCESS;
      }
    }
  }
LAB_00118f31:
  ares_array_destroy(local_1c0);
  ares_buf_destroy(buf_00);
  return aVar3;
}

Assistant:

ares_status_t ares_sconfig_append_fromstr(const ares_channel_t *channel,
                                          ares_llist_t        **sconfig,
                                          const char           *str,
                                          ares_bool_t           ignore_invalid)
{
  ares_status_t status = ARES_SUCCESS;
  ares_buf_t   *buf    = NULL;
  ares_array_t *list   = NULL;
  size_t        num;
  size_t        i;

  /* On Windows, there may be more than one nameserver specified in the same
   * registry key, so we parse input as a space or comma separated list.
   */
  buf = ares_buf_create_const((const unsigned char *)str, ares_strlen(str));
  if (buf == NULL) {
    status = ARES_ENOMEM;
    goto done;
  }

  status = ares_buf_split(buf, (const unsigned char *)" ,", 2,
                          ARES_BUF_SPLIT_NONE, 0, &list);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  num = ares_array_len(list);
  for (i = 0; i < num; i++) {
    ares_buf_t   **bufptr = ares_array_at(list, i);
    ares_buf_t    *entry  = *bufptr;
    ares_sconfig_t s;

    status = parse_nameserver_uri(entry, &s);
    if (status != ARES_SUCCESS) {
      status = parse_nameserver(entry, &s);
    }

    if (status != ARES_SUCCESS) {
      if (ignore_invalid) {
        continue;
      } else {
        goto done;
      }
    }

    status = ares_sconfig_append(channel, sconfig, &s.addr, s.udp_port,
                                 s.tcp_port, s.ll_iface);
    if (status != ARES_SUCCESS) {
      goto done; /* LCOV_EXCL_LINE: OutOfMemory */
    }
  }

  status = ARES_SUCCESS;

done:
  ares_array_destroy(list);
  ares_buf_destroy(buf);
  return status;
}